

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtCompoundCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  cbtCollisionShape *pcVar26;
  _func_int **pp_Var27;
  _func_int **pp_Var28;
  long *plVar29;
  cbtPersistentManifold *this_00;
  ulong uVar30;
  cbtTransform *pcVar31;
  cbtDbvtNode *pcVar32;
  cbtDbvtNode *pcVar33;
  cbtDbvtNode *pcVar34;
  void *pvVar35;
  cbtDispatcher *pcVar36;
  cbtSimplePair *ptr;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined4 uVar46;
  cbtSimplePair *pcVar47;
  long lVar48;
  cbtCollisionObject *pcVar49;
  int iVar50;
  long lVar51;
  cbtHashedSimplePairCache *pcVar52;
  cbtCollisionObject *pcVar53;
  cbtCompoundCompoundCollisionAlgorithm *pcVar54;
  int iVar55;
  int curSize;
  int iVar56;
  int iVar57;
  long lVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  cbtAlignedObjectArray<cbtDbvt::sStkNN> stkStack;
  cbtVector3 aabbMax0;
  cbtVector3 aabbMin0;
  cbtCollisionAlgorithm *algo;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  cbtCompoundCompoundLeafCallback callback;
  cbtPersistentManifold localManifolds [4];
  cbtAlignedObjectArray<cbtDbvt::sStkNN> local_1110;
  cbtCompoundCompoundCollisionAlgorithm *local_10f0;
  float local_10e8;
  float local_10e4;
  float local_10e0;
  float local_10d8;
  float local_10d4;
  float local_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  sStkNN *local_1090;
  cbtCollisionObjectWrapper *local_1088;
  cbtCollisionShape *local_1080;
  float local_1078;
  float local_1074;
  float local_1070;
  float local_106c;
  float local_1068;
  float local_1064;
  float local_1060;
  float local_1058;
  float local_1054;
  float local_1050;
  cbtCollisionObjectWrapper *local_1048;
  undefined1 local_1040 [32];
  cbtDispatcher *local_1020;
  undefined8 local_1018;
  cbtManifoldResult *local_1010;
  cbtHashedSimplePairCache *local_1008;
  cbtPersistentManifold *local_1000;
  long local_ff8;
  cbtCollisionShape *local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined1 local_f68 [16];
  undefined1 local_f58 [16];
  undefined1 local_f48 [16];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  undefined1 local_f08 [16];
  undefined1 local_ef8 [8];
  ulong uStack_ef0;
  uint local_ee8;
  float local_ee4;
  uint local_ee0;
  undefined4 local_edc;
  uint local_ed8;
  uint local_ed4;
  uint uStack_ed0;
  undefined4 local_ecc;
  undefined1 local_ec8 [8];
  float fStack_ec0;
  
  pcVar26 = body0Wrap->m_shape;
  local_1080 = body1Wrap->m_shape;
  pp_Var27 = pcVar26[3]._vptr_cbtCollisionShape;
  pp_Var28 = local_1080[3]._vptr_cbtCollisionShape;
  if (pp_Var27 == (_func_int **)0x0 || pp_Var28 == (_func_int **)0x0) {
    cbtCompoundCollisionAlgorithm::processCollision
              (&this->super_cbtCompoundCollisionAlgorithm,body0Wrap,body1Wrap,dispatchInfo,resultOut
              );
    return;
  }
  local_10a8._8_8_ = local_10a8._0_8_;
  local_10a8._0_8_ = dispatchInfo;
  local_1088 = body1Wrap;
  if ((pcVar26[3].m_shapeType != this->m_compoundShapeRevision0) ||
     (local_1080[3].m_shapeType != this->m_compoundShapeRevision1)) {
    removeChildAlgorithms(this);
    this->m_compoundShapeRevision0 = pcVar26[3].m_shapeType;
    this->m_compoundShapeRevision1 = local_1080[3].m_shapeType;
  }
  local_1040[0x18] = 1;
  lVar51 = 0;
  local_1040._16_8_ = (cbtPersistentManifold **)0x0;
  local_1040._4_4_ = 0;
  local_1040._8_4_ = 0;
  local_1048 = body0Wrap;
  do {
    cbtPersistentManifold::cbtPersistentManifold((cbtPersistentManifold *)(local_ef8 + lVar51));
    lVar51 = lVar51 + 0x3b0;
  } while (lVar51 != 0xec0);
  local_10c8._0_8_ = pp_Var27;
  local_10b8._0_8_ = pp_Var28;
  if (((cbtPersistentManifold **)local_1040._16_8_ != (cbtPersistentManifold **)0x0) &&
     ((bool)local_1040[0x18] == true)) {
    cbtAlignedFreeInternal((void *)local_1040._16_8_);
  }
  local_1040._8_4_ = 4;
  local_1040._24_8_ = local_1040._24_8_ & 0xffffffffffffff00;
  local_1040._16_8_ = local_ef8;
  pcVar52 = this->m_childCollisionAlgorithmCache;
  local_10f0 = this;
  local_ff0 = pcVar26;
  if (0 < (pcVar52->m_overlappingPairArray).m_size) {
    lVar51 = 0;
    do {
      local_1040._4_4_ = 0;
      plVar29 = (long *)(pcVar52->m_overlappingPairArray).m_data[lVar51].field_2.m_userPointer;
      if (plVar29 != (long *)0x0) {
        (**(code **)(*plVar29 + 0x20))(plVar29,local_1040);
        if (0 < (int)local_1040._4_4_) {
          lVar58 = 0;
          do {
            this_00 = *(cbtPersistentManifold **)(local_1040._16_8_ + lVar58 * 8);
            if (this_00->m_cachedPoints != 0) {
              resultOut->m_manifoldPtr = this_00;
              pcVar53 = resultOut->m_body0Wrap->m_collisionObject;
              if (this_00->m_body0 == pcVar53) {
                pcVar49 = resultOut->m_body1Wrap->m_collisionObject;
              }
              else {
                pcVar49 = pcVar53;
                pcVar53 = resultOut->m_body1Wrap->m_collisionObject;
              }
              cbtPersistentManifold::refreshContactPoints
                        (this_00,&pcVar53->m_worldTransform,&pcVar49->m_worldTransform);
              resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
            }
            lVar58 = lVar58 + 1;
          } while (lVar58 < (int)local_1040._4_4_);
        }
        uVar46 = local_1040._4_4_;
        if ((int)local_1040._4_4_ < 1) {
          if (((int)local_1040._4_4_ < 0) && ((int)local_1040._8_4_ < 0)) {
            if (((cbtPersistentManifold **)local_1040._16_8_ != (cbtPersistentManifold **)0x0) &&
               ((bool)local_1040[0x18] == true)) {
              cbtAlignedFreeInternal((void *)local_1040._16_8_);
            }
            local_1040[0x18] = 1;
            local_1040._16_8_ = (cbtPersistentManifold **)0x0;
            local_1040._8_4_ = 0;
          }
          if ((int)uVar46 < 0) {
            lVar58 = (long)(int)uVar46;
            do {
              *(cbtPersistentManifold **)(local_1040._16_8_ + lVar58 * 8) =
                   (cbtPersistentManifold *)0x0;
              lVar58 = lVar58 + 1;
            } while (lVar58 != 0);
          }
        }
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 < (pcVar52->m_overlappingPairArray).m_size);
  }
  local_1040._4_4_ = 0;
  cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
            ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)local_1040);
  local_1008 = local_10f0->m_childCollisionAlgorithmCache;
  local_1020 = (local_10f0->super_cbtCompoundCollisionAlgorithm).
               super_cbtActivatingCollisionAlgorithm.super_cbtCollisionAlgorithm.m_dispatcher;
  local_1000 = (local_10f0->super_cbtCompoundCollisionAlgorithm).m_sharedManifold;
  local_1040._0_4_ = 0xb704a8;
  local_1040._4_4_ = 0;
  local_1040._8_4_ = 0;
  local_1040._16_8_ = local_1048;
  local_1040._24_8_ = local_1088;
  local_1018 = local_10a8._0_8_;
  local_1010 = resultOut;
  cbtTransform::inverse(local_1048->m_worldTransform);
  lVar51 = *(long *)local_10c8._0_8_;
  if ((lVar51 != 0) && (uVar30 = *(ulong *)local_10b8._0_8_, uVar30 != 0)) {
    pcVar31 = local_1088->m_worldTransform;
    cVar4 = (pcVar31->m_basis).m_el[1].m_floats[0];
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_ef8._4_4_));
    cVar5 = (pcVar31->m_basis).m_el[0].m_floats[0];
    cVar6 = (pcVar31->m_basis).m_el[0].m_floats[1];
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar5),ZEXT416((uint)local_ef8._0_4_));
    cVar7 = (pcVar31->m_basis).m_el[2].m_floats[0];
    local_10a8 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar7),ZEXT416((uint)uStack_ef0));
    cVar8 = (pcVar31->m_basis).m_el[1].m_floats[1];
    auVar59 = vmulss_avx512f(ZEXT416((uint)local_ef8._4_4_),ZEXT416((uint)cVar8));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar6),ZEXT416((uint)local_ef8._0_4_));
    cVar9 = (pcVar31->m_basis).m_el[2].m_floats[1];
    local_10b8 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416((uint)uStack_ef0));
    cVar10 = (pcVar31->m_basis).m_el[0].m_floats[2];
    cVar11 = (pcVar31->m_basis).m_el[1].m_floats[2];
    auVar59 = vmulss_avx512f(ZEXT416((uint)local_ef8._4_4_),ZEXT416((uint)cVar11));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar10),ZEXT416((uint)local_ef8._0_4_));
    cVar12 = (pcVar31->m_basis).m_el[2].m_floats[2];
    local_10c8 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar12),ZEXT416((uint)uStack_ef0));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)local_ee4));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar5),ZEXT416(local_ee8));
    local_f38 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar7),ZEXT416(local_ee0));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar8),ZEXT416((uint)local_ee4));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar6),ZEXT416(local_ee8));
    local_f48 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(local_ee0));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar11),ZEXT416((uint)local_ee4));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar10),ZEXT416(local_ee8));
    local_f58 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar12),ZEXT416(local_ee0));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416(local_ed4));
    auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(local_ed8),ZEXT416((uint)cVar5));
    local_f98 = vfmadd231ss_avx512f(auVar59,ZEXT416(uStack_ed0),ZEXT416((uint)cVar7));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar8),ZEXT416(local_ed4));
    auVar59 = vfmadd231ss_fma(auVar59,ZEXT416(local_ed8),ZEXT416((uint)cVar6));
    local_fa8 = vfmadd231ss_fma(auVar59,ZEXT416(uStack_ed0),ZEXT416((uint)cVar9));
    auVar59 = vmulss_avx512f(ZEXT416((uint)cVar11),ZEXT416(local_ed4));
    auVar59 = vfmadd231ss_fma(auVar59,ZEXT416(local_ed8),ZEXT416((uint)cVar10));
    local_fb8 = vfmadd231ss_fma(auVar59,ZEXT416(uStack_ed0),ZEXT416((uint)cVar12));
    cVar4 = (pcVar31->m_origin).m_floats[0];
    fVar13 = (pcVar31->m_origin).m_floats[1];
    auVar59 = vfmadd231ss_fma(ZEXT416((uint)((float)local_ef8._4_4_ * fVar13)),ZEXT416((uint)cVar4),
                              ZEXT416((uint)local_ef8._0_4_));
    cVar5 = (pcVar31->m_origin).m_floats[2];
    auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar5),ZEXT416((uint)uStack_ef0));
    auVar40 = vfmadd231ss_fma(ZEXT416((uint)(local_ee4 * fVar13)),ZEXT416((uint)cVar4),
                              ZEXT416(local_ee8));
    auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar5),ZEXT416(local_ee0));
    auVar60 = vmulss_avx512f(ZEXT416(local_ed4),ZEXT416((uint)fVar13));
    auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)cVar4),ZEXT416(local_ed8));
    auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)cVar5),ZEXT416(uStack_ed0));
    local_106c = auVar59._0_4_ + (float)local_ec8._0_4_;
    local_1074 = auVar40._0_4_ + (float)local_ec8._4_4_;
    local_1078 = auVar60._0_4_ + fStack_ec0;
    local_1070 = resultOut->m_closestPointDistanceThreshold;
    local_1110.m_ownsMemory = false;
    local_1110.m_size = 0x80;
    local_1110.m_capacity = 0x80;
    auVar59._8_4_ = 0x7fffffff;
    auVar59._0_8_ = 0x7fffffff7fffffff;
    auVar59._12_4_ = 0x7fffffff;
    local_f08 = vandps_avx512vl(local_10a8,auVar59);
    local_f18 = vandps_avx512vl(local_10b8,auVar59);
    local_f28 = vandps_avx512vl(local_10c8,auVar59);
    local_f68 = vandps_avx512vl(local_f38,auVar59);
    local_f78 = vandps_avx512vl(local_f48,auVar59);
    local_f88 = vandps_avx512vl(local_f58,auVar59);
    local_fc8 = vandps_avx512vl(local_f98,auVar59);
    local_fd8 = vandps_avx(local_fa8,auVar59);
    local_fe8 = vandps_avx(local_fb8,auVar59);
    iVar56 = 1;
    iVar55 = 0x7c;
    local_1110.m_data = (sStkNN *)local_ef8;
    local_ef8 = (undefined1  [8])lVar51;
    uStack_ef0 = uVar30;
    do {
      lVar58 = (long)iVar56;
      iVar57 = iVar56 + -1;
      lVar51 = lVar58 + -1;
      pcVar32 = local_1110.m_data[lVar51].a;
      pcVar33 = local_1110.m_data[lVar51].b;
      fVar13 = (pcVar33->volume).mx.m_floats[0];
      fVar14 = (pcVar33->volume).mi.m_floats[0];
      fVar15 = (pcVar33->volume).mi.m_floats[1];
      fVar16 = (pcVar33->volume).mx.m_floats[1];
      fVar17 = (pcVar33->volume).mx.m_floats[2];
      fVar18 = (pcVar33->volume).mi.m_floats[2];
      fVar37 = (fVar13 - fVar14) * 0.5 + 0.0;
      fVar38 = (fVar16 - fVar15) * 0.5 + 0.0;
      fVar39 = (fVar17 - fVar18) * 0.5 + 0.0;
      fVar14 = (fVar13 + fVar14) * 0.5;
      fVar15 = (fVar16 + fVar15) * 0.5;
      fVar16 = (fVar18 + fVar17) * 0.5;
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (float)local_10b8._0_4_)),
                                ZEXT416((uint)fVar14),ZEXT416((uint)local_10a8._0_4_));
      auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar16),ZEXT416((uint)local_10c8._0_4_));
      fVar13 = auVar59._0_4_ + local_106c;
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * (float)local_f18._0_4_)),
                                ZEXT416((uint)fVar37),ZEXT416((uint)local_f08._0_4_));
      auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar39),ZEXT416((uint)local_f28._0_4_));
      if (((pcVar32->volume).mi.m_floats[0] <= local_1070 + auVar59._0_4_ + fVar13) &&
         ((fVar13 - auVar59._0_4_) - local_1070 <= (pcVar32->volume).mx.m_floats[0])) {
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (float)local_f48._0_4_)),
                                  ZEXT416((uint)fVar14),ZEXT416((uint)local_f38._0_4_));
        auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar16),ZEXT416((uint)local_f58._0_4_));
        fVar13 = auVar59._0_4_ + local_1074;
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * (float)local_f78._0_4_)),
                                  ZEXT416((uint)fVar37),ZEXT416((uint)local_f68._0_4_));
        auVar59 = vfmadd231ss_fma(auVar59,ZEXT416((uint)fVar39),ZEXT416((uint)local_f88._0_4_));
        if (((pcVar32->volume).mi.m_floats[1] <= local_1070 + auVar59._0_4_ + fVar13) &&
           ((fVar13 - auVar59._0_4_) - local_1070 <= (pcVar32->volume).mx.m_floats[1])) {
          auVar59 = vfmadd132ss_fma(ZEXT416((uint)fVar14),
                                    ZEXT416((uint)(fVar15 * (float)local_fa8._0_4_)),
                                    ZEXT416((uint)local_f98._0_4_));
          auVar59 = vfmadd132ss_fma(ZEXT416((uint)fVar16),auVar59,ZEXT416((uint)local_fb8._0_4_));
          fVar13 = auVar59._0_4_ + local_1078;
          auVar59 = vfmadd132ss_fma(ZEXT416((uint)fVar37),
                                    ZEXT416((uint)(fVar38 * (float)local_fd8._0_4_)),
                                    ZEXT416((uint)local_fc8._0_4_));
          auVar59 = vfmadd132ss_fma(ZEXT416((uint)fVar39),auVar59,ZEXT416((uint)local_fe8._0_4_));
          if (((pcVar32->volume).mi.m_floats[2] <= local_1070 + auVar59._0_4_ + fVar13) &&
             ((fVar13 - auVar59._0_4_) - local_1070 <= (pcVar32->volume).mx.m_floats[2])) {
            if (iVar55 < iVar57) {
              lVar48 = (long)local_1110.m_size * 2;
              iVar55 = (int)lVar48;
              if (((local_1110.m_size <= iVar55) && (local_1110.m_size < iVar55)) &&
                 (local_1110.m_capacity < iVar55)) {
                local_ff8 = lVar48;
                if (local_1110.m_size == 0) {
                  local_1090 = (sStkNN *)0x0;
                }
                else {
                  local_1090 = (sStkNN *)cbtAlignedAllocInternal((long)local_1110.m_size << 5,0x10);
                }
                if (0 < (long)local_1110.m_size) {
                  lVar48 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)&(local_1110.m_data)->a + lVar48);
                    uVar45 = puVar2[1];
                    puVar3 = (undefined8 *)((long)&local_1090->a + lVar48);
                    *puVar3 = *puVar2;
                    puVar3[1] = uVar45;
                    lVar48 = lVar48 + 0x10;
                  } while ((long)local_1110.m_size * 0x10 != lVar48);
                }
                if ((local_1110.m_data != (sStkNN *)0x0) && (local_1110.m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(local_1110.m_data);
                }
                local_1110.m_ownsMemory = true;
                local_1110.m_data = local_1090;
                local_1110.m_capacity = (int)local_ff8;
                lVar48 = local_ff8;
              }
              local_1110.m_size = (int)lVar48;
              iVar55 = local_1110.m_size + -4;
            }
            if ((pcVar32->field_2).childs[1] == (cbtDbvtNode *)0x0) {
              if ((pcVar33->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                (**(code **)(CONCAT44(local_1040._4_4_,local_1040._0_4_) + 0x10))
                          (local_1040,pcVar32,pcVar33);
              }
              else {
                pcVar34 = (pcVar33->field_2).childs[0];
                local_1110.m_data[lVar51].a = pcVar32;
                local_1110.m_data[lVar51].b = pcVar34;
                pcVar33 = (pcVar33->field_2).childs[1];
                local_1110.m_data[lVar58].a = pcVar32;
                local_1110.m_data[lVar58].b = pcVar33;
                iVar57 = iVar56 + 1;
              }
            }
            else if ((pcVar33->field_2).childs[1] == (cbtDbvtNode *)0x0) {
              local_1110.m_data[lVar51].a = (pcVar32->field_2).childs[0];
              local_1110.m_data[lVar51].b = pcVar33;
              local_1110.m_data[lVar58].a = (pcVar32->field_2).childs[1];
              local_1110.m_data[lVar58].b = pcVar33;
              iVar57 = iVar56 + 1;
            }
            else {
              pcVar34 = (pcVar33->field_2).childs[0];
              local_1110.m_data[lVar51].a = (pcVar32->field_2).childs[0];
              local_1110.m_data[lVar51].b = pcVar34;
              pcVar34 = (pcVar33->field_2).childs[0];
              local_1110.m_data[lVar58].a = (pcVar32->field_2).childs[1];
              local_1110.m_data[lVar58].b = pcVar34;
              pcVar34 = (pcVar33->field_2).childs[1];
              local_1110.m_data[lVar58 + 1].a = (pcVar32->field_2).childs[0];
              local_1110.m_data[lVar58 + 1].b = pcVar34;
              pcVar33 = (pcVar33->field_2).childs[1];
              local_1110.m_data[lVar58 + 2].a = (pcVar32->field_2).childs[1];
              local_1110.m_data[lVar58 + 2].b = pcVar33;
              iVar57 = iVar56 + 3;
            }
          }
        }
      }
      iVar56 = iVar57;
    } while (iVar56 != 0);
    cbtAlignedObjectArray<cbtDbvt::sStkNN>::~cbtAlignedObjectArray(&local_1110);
  }
  pcVar52 = local_10f0->m_childCollisionAlgorithmCache;
  local_1110.m_ownsMemory = true;
  local_1110.m_data = (sStkNN *)0x0;
  local_1110.m_size = 0;
  local_1110.m_capacity = 0;
  if (0 < (pcVar52->m_overlappingPairArray).m_size) {
    lVar51 = 0;
    local_10c8._0_8_ = pcVar52;
    do {
      pvVar35 = (pcVar52->m_overlappingPairArray).m_data[lVar51].field_2.m_userPointer;
      local_10a8._0_8_ = pvVar35;
      if (pvVar35 != (void *)0x0) {
        pvVar35 = local_ff0[1].m_userPointer;
        lVar58 = (long)(pcVar52->m_overlappingPairArray).m_data[lVar51].m_indexA * 0x58;
        plVar29 = *(long **)((long)pvVar35 + lVar58 + 0x40);
        pcVar31 = local_1048->m_worldTransform;
        fVar13 = *(float *)((long)pvVar35 + lVar58 + 0x10);
        cVar4 = (pcVar31->m_basis).m_el[0].m_floats[0];
        fVar14 = (pcVar31->m_basis).m_el[0].m_floats[1];
        uVar19 = *(uint *)((long)pvVar35 + lVar58);
        uVar20 = *(uint *)((long)pvVar35 + lVar58 + 4);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar14)),ZEXT416(uVar19),
                                  ZEXT416((uint)cVar4));
        uVar21 = *(uint *)((long)pvVar35 + lVar58 + 0x20);
        cVar5 = (pcVar31->m_basis).m_el[0].m_floats[2];
        auVar40 = vfmadd231ss_fma(auVar59,ZEXT416(uVar21),ZEXT416((uint)cVar5));
        fVar15 = *(float *)((long)pvVar35 + lVar58 + 0x14);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar14)),ZEXT416(uVar20),
                                  ZEXT416((uint)cVar4));
        uVar22 = *(uint *)((long)pvVar35 + lVar58 + 0x24);
        auVar60 = vfmadd231ss_fma(auVar59,ZEXT416(uVar22),ZEXT416((uint)cVar5));
        uVar23 = *(uint *)((long)pvVar35 + lVar58 + 8);
        fVar16 = *(float *)((long)pvVar35 + lVar58 + 0x18);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar14)),ZEXT416(uVar23),
                                  ZEXT416((uint)cVar4));
        uVar24 = *(uint *)((long)pvVar35 + lVar58 + 0x28);
        auVar41 = vfmadd231ss_fma(auVar59,ZEXT416(uVar24),ZEXT416((uint)cVar5));
        cVar6 = (pcVar31->m_basis).m_el[1].m_floats[0];
        cVar7 = (pcVar31->m_basis).m_el[1].m_floats[1];
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar19),ZEXT416((uint)cVar6));
        cVar8 = (pcVar31->m_basis).m_el[1].m_floats[2];
        auVar61 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar21),ZEXT416((uint)cVar8));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar20),ZEXT416((uint)cVar6));
        auVar62 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar22),ZEXT416((uint)cVar8));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar16),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar23),ZEXT416((uint)cVar6));
        auVar63 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar24),ZEXT416((uint)cVar8));
        cVar9 = (pcVar31->m_basis).m_el[2].m_floats[0];
        cVar10 = (pcVar31->m_basis).m_el[2].m_floats[1];
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar19));
        cVar11 = (pcVar31->m_basis).m_el[2].m_floats[2];
        auVar42 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar21));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar20));
        auVar43 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar22));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar16),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar23));
        auVar44 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar24));
        uVar19 = *(uint *)((long)pvVar35 + lVar58 + 0x30);
        fVar13 = *(float *)((long)pvVar35 + lVar58 + 0x34);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar14)),ZEXT416(uVar19),
                                  ZEXT416((uint)cVar4));
        uVar20 = *(uint *)((long)pvVar35 + lVar58 + 0x38);
        auVar59 = vfmadd231ss_fma(auVar59,ZEXT416(uVar20),ZEXT416((uint)cVar5));
        auVar64 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)fVar13));
        auVar64 = vfmadd231ss_fma(auVar64,ZEXT416(uVar19),ZEXT416((uint)cVar6));
        auVar65 = vfmadd231ss_avx512f(auVar64,ZEXT416(uVar20),ZEXT416((uint)cVar8));
        auVar64 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416((uint)fVar13));
        auVar64 = vfmadd231ss_avx512f(auVar64,ZEXT416(uVar19),ZEXT416((uint)cVar9));
        auVar64 = vfmadd231ss_fma(auVar64,ZEXT416(uVar20),ZEXT416((uint)cVar11));
        auVar59 = vinsertps_avx(ZEXT416((uint)(auVar59._0_4_ + (pcVar31->m_origin).m_floats[0])),
                                ZEXT416((uint)(auVar65._0_4_ + (pcVar31->m_origin).m_floats[1])),
                                0x10);
        _local_ec8 = vinsertps_avx(auVar59,ZEXT416((uint)(auVar64._0_4_ +
                                                         (pcVar31->m_origin).m_floats[2])),0x28);
        local_ef8._4_4_ = auVar60._0_4_;
        local_ef8._0_4_ = auVar40._0_4_;
        uStack_ef0 = (ulong)auVar41._0_4_;
        local_ee8 = auVar61._0_4_;
        local_ee4 = auVar62._0_4_;
        local_ee0 = auVar63._0_4_;
        local_edc = 0;
        local_ed8 = auVar42._0_4_;
        local_ed4 = auVar43._0_4_;
        uStack_ed0 = auVar44._0_4_;
        local_ecc = 0;
        (**(code **)(*plVar29 + 0x10))(plVar29,local_ef8,&local_10d8,&local_10e8);
        fVar13 = resultOut->m_closestPointDistanceThreshold;
        local_10d8 = local_10d8 - fVar13;
        local_10d4 = local_10d4 - fVar13;
        local_10d0 = local_10d0 - fVar13;
        local_10e8 = fVar13 + local_10e8;
        local_10e4 = fVar13 + local_10e4;
        local_10b8._0_4_ = fVar13;
        local_10e0 = fVar13 + local_10e0;
        pvVar35 = local_1080[1].m_userPointer;
        lVar58 = (long)(pcVar52->m_overlappingPairArray).m_data[lVar51].m_indexB * 0x58;
        plVar29 = *(long **)((long)pvVar35 + lVar58 + 0x40);
        pcVar31 = local_1088->m_worldTransform;
        fVar13 = *(float *)((long)pvVar35 + lVar58 + 0x10);
        cVar4 = (pcVar31->m_basis).m_el[0].m_floats[0];
        fVar14 = (pcVar31->m_basis).m_el[0].m_floats[1];
        uVar19 = *(uint *)((long)pvVar35 + lVar58);
        uVar20 = *(uint *)((long)pvVar35 + lVar58 + 4);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar14)),ZEXT416(uVar19),
                                  ZEXT416((uint)cVar4));
        uVar21 = *(uint *)((long)pvVar35 + lVar58 + 0x20);
        cVar5 = (pcVar31->m_basis).m_el[0].m_floats[2];
        auVar40 = vfmadd231ss_fma(auVar59,ZEXT416(uVar21),ZEXT416((uint)cVar5));
        fVar15 = *(float *)((long)pvVar35 + lVar58 + 0x14);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar14)),ZEXT416(uVar20),
                                  ZEXT416((uint)cVar4));
        uVar22 = *(uint *)((long)pvVar35 + lVar58 + 0x24);
        auVar60 = vfmadd231ss_fma(auVar59,ZEXT416(uVar22),ZEXT416((uint)cVar5));
        uVar23 = *(uint *)((long)pvVar35 + lVar58 + 8);
        fVar16 = *(float *)((long)pvVar35 + lVar58 + 0x18);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar14)),ZEXT416(uVar23),
                                  ZEXT416((uint)cVar4));
        uVar24 = *(uint *)((long)pvVar35 + lVar58 + 0x28);
        auVar41 = vfmadd231ss_fma(auVar59,ZEXT416(uVar24),ZEXT416((uint)cVar5));
        cVar6 = (pcVar31->m_basis).m_el[1].m_floats[0];
        cVar7 = (pcVar31->m_basis).m_el[1].m_floats[1];
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar19),ZEXT416((uint)cVar6));
        cVar8 = (pcVar31->m_basis).m_el[1].m_floats[2];
        auVar61 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar21),ZEXT416((uint)cVar8));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar20),ZEXT416((uint)cVar6));
        auVar62 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar22),ZEXT416((uint)cVar8));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar16),ZEXT416((uint)cVar7));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar23),ZEXT416((uint)cVar6));
        auVar63 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar24),ZEXT416((uint)cVar8));
        cVar9 = (pcVar31->m_basis).m_el[2].m_floats[0];
        cVar10 = (pcVar31->m_basis).m_el[2].m_floats[1];
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar19));
        cVar11 = (pcVar31->m_basis).m_el[2].m_floats[2];
        auVar42 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar21));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar20));
        auVar43 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar22));
        auVar59 = vmulss_avx512f(ZEXT416((uint)fVar16),ZEXT416((uint)cVar10));
        auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416((uint)cVar9),ZEXT416(uVar23));
        auVar44 = vfmadd231ss_fma(auVar59,ZEXT416((uint)cVar11),ZEXT416(uVar24));
        uVar19 = *(uint *)((long)pvVar35 + lVar58 + 0x30);
        fVar13 = *(float *)((long)pvVar35 + lVar58 + 0x34);
        auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar14)),ZEXT416(uVar19),
                                  ZEXT416((uint)cVar4));
        uVar20 = *(uint *)((long)pvVar35 + lVar58 + 0x38);
        auVar59 = vfmadd231ss_fma(auVar59,ZEXT416(uVar20),ZEXT416((uint)cVar5));
        auVar64 = vmulss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)fVar13));
        auVar64 = vfmadd231ss_fma(auVar64,ZEXT416(uVar19),ZEXT416((uint)cVar6));
        auVar65 = vfmadd231ss_avx512f(auVar64,ZEXT416(uVar20),ZEXT416((uint)cVar8));
        auVar64 = vmulss_avx512f(ZEXT416((uint)cVar10),ZEXT416((uint)fVar13));
        auVar64 = vfmadd231ss_avx512f(auVar64,ZEXT416(uVar19),ZEXT416((uint)cVar9));
        auVar64 = vfmadd231ss_fma(auVar64,ZEXT416(uVar20),ZEXT416((uint)cVar11));
        auVar59 = vinsertps_avx(ZEXT416((uint)(auVar59._0_4_ + (pcVar31->m_origin).m_floats[0])),
                                ZEXT416((uint)(auVar65._0_4_ + (pcVar31->m_origin).m_floats[1])),
                                0x10);
        _local_ec8 = vinsertps_avx(auVar59,ZEXT416((uint)(auVar64._0_4_ +
                                                         (pcVar31->m_origin).m_floats[2])),0x28);
        local_ef8._4_4_ = auVar60._0_4_;
        local_ef8._0_4_ = auVar40._0_4_;
        uStack_ef0 = (ulong)auVar41._0_4_;
        local_ee8 = auVar61._0_4_;
        local_ee4 = auVar62._0_4_;
        local_ee0 = auVar63._0_4_;
        local_edc = 0;
        local_ed8 = auVar42._0_4_;
        local_ed4 = auVar43._0_4_;
        uStack_ed0 = auVar44._0_4_;
        local_ecc = 0;
        (**(code **)(*plVar29 + 0x10))(plVar29,local_ef8,&local_1058,&local_1068);
        local_1058 = local_1058 - (float)local_10b8._0_4_;
        local_1054 = local_1054 - (float)local_10b8._0_4_;
        local_1050 = local_1050 - (float)local_10b8._0_4_;
        local_1068 = (float)local_10b8._0_4_ + local_1068;
        local_1064 = (float)local_10b8._0_4_ + local_1064;
        local_1060 = (float)local_10b8._0_4_ + local_1060;
        if (((local_1064 < local_10d4) || (local_10e4 < local_1054)) ||
           ((local_1060 < local_10d0 ||
            (((local_10e0 < local_1050 || (local_1068 < local_10d8)) ||
             (pcVar52 = (cbtHashedSimplePairCache *)local_10c8._0_8_, local_10e8 < local_1058))))))
        {
          uVar45 = local_10a8._0_8_;
          (*(code *)**(undefined8 **)local_10a8._0_8_)(local_10a8._0_8_);
          pcVar54 = local_10f0;
          pcVar36 = (local_10f0->super_cbtCompoundCollisionAlgorithm).
                    super_cbtActivatingCollisionAlgorithm.super_cbtCollisionAlgorithm.m_dispatcher;
          (*pcVar36->_vptr_cbtDispatcher[0xf])(pcVar36,uVar45);
          pcVar47 = ((cbtSimplePairArray *)(local_10c8._0_8_ + 8))->m_data;
          iVar55 = pcVar47[lVar51].m_indexA;
          iVar56 = pcVar47[lVar51].m_indexB;
          iVar57 = (pcVar54->m_removePairs).m_size;
          iVar25 = (pcVar54->m_removePairs).m_capacity;
          if (iVar57 == iVar25) {
            iVar50 = iVar57 * 2;
            if (iVar57 == 0) {
              iVar50 = 1;
            }
            if (iVar25 < iVar50) {
              local_10b8._0_4_ = iVar56;
              local_10a8._0_4_ = iVar55;
              if (iVar50 == 0) {
                pcVar47 = (cbtSimplePair *)0x0;
              }
              else {
                pcVar47 = (cbtSimplePair *)cbtAlignedAllocInternal((long)iVar50 << 4,0x10);
              }
              lVar58 = (long)(local_10f0->m_removePairs).m_size;
              if (0 < lVar58) {
                lVar48 = 0;
                do {
                  puVar2 = (undefined8 *)
                           ((long)&((local_10f0->m_removePairs).m_data)->m_indexA + lVar48);
                  uVar45 = puVar2[1];
                  puVar3 = (undefined8 *)((long)&pcVar47->m_indexA + lVar48);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar45;
                  lVar48 = lVar48 + 0x10;
                } while (lVar58 * 0x10 != lVar48);
              }
              ptr = (local_10f0->m_removePairs).m_data;
              if (ptr != (cbtSimplePair *)0x0) {
                if ((local_10f0->m_removePairs).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ptr);
                }
                (local_10f0->m_removePairs).m_data = (cbtSimplePair *)0x0;
              }
              (local_10f0->m_removePairs).m_ownsMemory = true;
              (local_10f0->m_removePairs).m_data = pcVar47;
              (local_10f0->m_removePairs).m_capacity = iVar50;
              pcVar54 = local_10f0;
              iVar55 = local_10a8._0_4_;
              iVar56 = local_10b8._0_4_;
            }
          }
          pcVar47 = (pcVar54->m_removePairs).m_data;
          iVar57 = (pcVar54->m_removePairs).m_size;
          pcVar47[iVar57].m_indexA = iVar55;
          pcVar47[iVar57].m_indexB = iVar56;
          pcVar47[iVar57].field_2.m_userPointer = (void *)0x0;
          piVar1 = &(pcVar54->m_removePairs).m_size;
          *piVar1 = *piVar1 + 1;
          pcVar52 = (cbtHashedSimplePairCache *)local_10c8._0_8_;
        }
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 < (pcVar52->m_overlappingPairArray).m_size);
  }
  pcVar54 = local_10f0;
  if (0 < (local_10f0->m_removePairs).m_size) {
    lVar51 = 4;
    lVar58 = 0;
    do {
      pcVar47 = (pcVar54->m_removePairs).m_data;
      (*pcVar54->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[2])
                (pcVar54->m_childCollisionAlgorithmCache,
                 (ulong)*(uint *)((long)pcVar47 + lVar51 + -4),
                 (ulong)*(uint *)((long)&pcVar47->m_indexA + lVar51));
      lVar58 = lVar58 + 1;
      lVar51 = lVar51 + 0x10;
    } while (lVar58 < (pcVar54->m_removePairs).m_size);
  }
  pcVar47 = (pcVar54->m_removePairs).m_data;
  if (pcVar47 != (cbtSimplePair *)0x0) {
    if ((pcVar54->m_removePairs).m_ownsMemory == true) {
      cbtAlignedFreeInternal(pcVar47);
    }
    (pcVar54->m_removePairs).m_data = (cbtSimplePair *)0x0;
  }
  (pcVar54->m_removePairs).m_ownsMemory = true;
  (pcVar54->m_removePairs).m_data = (cbtSimplePair *)0x0;
  (pcVar54->m_removePairs).m_size = 0;
  (pcVar54->m_removePairs).m_capacity = 0;
  cbtAlignedObjectArray<cbtPersistentManifold_*>::~cbtAlignedObjectArray
            ((cbtAlignedObjectArray<cbtPersistentManifold_*> *)&local_1110);
  return;
}

Assistant:

void cbtCompoundCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	const cbtCollisionObjectWrapper* col1ObjWrap = body1Wrap;

	cbtAssert(col0ObjWrap->getCollisionShape()->isCompound());
	cbtAssert(col1ObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(col0ObjWrap->getCollisionShape());
	const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(col1ObjWrap->getCollisionShape());

	const cbtDbvt* tree0 = compoundShape0->getDynamicAabbTree();
	const cbtDbvt* tree1 = compoundShape1->getDynamicAabbTree();
	if (!tree0 || !tree1)
	{
		return cbtCompoundCollisionAlgorithm::processCollision(body0Wrap, body1Wrap, dispatchInfo, resultOut);
	}
	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if ((compoundShape0->getUpdateRevision() != m_compoundShapeRevision0) || (compoundShape1->getUpdateRevision() != m_compoundShapeRevision1))
	{
		///clear all
		removeChildAlgorithms();
		m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();
		m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
	}

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		cbtManifoldArray manifoldArray;
#ifdef USE_LOCAL_STACK
		cbtPersistentManifold localManifolds[4];
		manifoldArray.initializeFromBuffer(&localManifolds, 0, 4);
#endif
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();
		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;
				algo->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	cbtCompoundCompoundLeafCallback callback(col0ObjWrap, col1ObjWrap, this->m_dispatcher, dispatchInfo, resultOut, this->m_childCollisionAlgorithmCache, m_sharedManifold);

	const cbtTransform xform = col0ObjWrap->getWorldTransform().inverse() * col1ObjWrap->getWorldTransform();
	MycollideTT(tree0->m_root, tree1->m_root, xform, &callback, resultOut->m_closestPointDistanceThreshold);

	//printf("#compound-compound child/leaf overlap =%d                      \r",callback.m_numOverlapPairs);

	//remove non-overlapping child pairs

	{
		cbtAssert(m_removePairs.size() == 0);

		//iterate over all children, perform an AABB check inside ProcessChildShape
		cbtSimplePairArray& pairs = m_childCollisionAlgorithmCache->getOverlappingPairArray();

		int i;
		cbtManifoldArray manifoldArray;

		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < pairs.size(); i++)
		{
			if (pairs[i].m_userPointer)
			{
				cbtCollisionAlgorithm* algo = (cbtCollisionAlgorithm*)pairs[i].m_userPointer;

				{
					const cbtCollisionShape* childShape0 = 0;

					cbtTransform newChildWorldTrans0;
					childShape0 = compoundShape0->getChildShape(pairs[i].m_indexA);
					const cbtTransform& childTrans0 = compoundShape0->getChildTransform(pairs[i].m_indexA);
					newChildWorldTrans0 = col0ObjWrap->getWorldTransform() * childTrans0;
					childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
				}
				cbtVector3 thresholdVec(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
				aabbMin0 -= thresholdVec;
				aabbMax0 += thresholdVec;
				{
					const cbtCollisionShape* childShape1 = 0;
					cbtTransform newChildWorldTrans1;

					childShape1 = compoundShape1->getChildShape(pairs[i].m_indexB);
					const cbtTransform& childTrans1 = compoundShape1->getChildTransform(pairs[i].m_indexB);
					newChildWorldTrans1 = col1ObjWrap->getWorldTransform() * childTrans1;
					childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);
				}

				aabbMin1 -= thresholdVec;
				aabbMax1 += thresholdVec;

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					algo->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(algo);
					m_removePairs.push_back(cbtSimplePair(pairs[i].m_indexA, pairs[i].m_indexB));
				}
			}
		}
		for (int i = 0; i < m_removePairs.size(); i++)
		{
			m_childCollisionAlgorithmCache->removeOverlappingPair(m_removePairs[i].m_indexA, m_removePairs[i].m_indexB);
		}
		m_removePairs.clear();
	}
}